

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void lj_asm_patchexit(jit_State *J,GCtrace *T,ExitNo exitno,MCode *target)

{
  MCode *pMVar1;
  uint32_t uVar2;
  MCode *ptr;
  ulong uVar3;
  long lVar4;
  ushort *ptr_00;
  ushort *puVar5;
  
  ptr_00 = (ushort *)T->mcode;
  ptr = lj_mcode_patch(J,(MCode *)ptr_00,0);
  uVar3 = (ulong)T->szmcode;
  pMVar1 = J->exitstubgroup[exitno >> 5];
  puVar5 = (ushort *)((long)ptr_00 + (uVar3 - 6));
  if (((5 < uVar3) && (*(char *)((long)ptr_00 + (ulong)(T->szmcode - 5)) == -0x17)) &&
     (lVar4 = uVar3 + (long)ptr_00,
     (MCode *)((long)*(int *)(lVar4 + -4) + (long)puVar5) ==
     pMVar1 + (ulong)(exitno & 0x1f) * 4 + -6)) {
    *(int *)(lVar4 + -4) = (int)target - (int)lVar4;
  }
  for (; (ptr_00 < puVar5 &&
         ((*(int *)((long)ptr_00 + 3) != (int)J + -0xe8 || ((char)*ptr_00 != -0x39))));
      ptr_00 = (ushort *)((long)ptr_00 + (ulong)uVar2)) {
    uVar2 = asm_x86_inslen((uint8_t *)ptr_00);
  }
  for (; ptr_00 < puVar5; ptr_00 = (ushort *)((long)ptr_00 + (ulong)uVar2)) {
    if (((*ptr_00 & 0xf0ff) == 0x800f) &&
       ((MCode *)((long)*(int *)(ptr_00 + 1) + (long)ptr_00) ==
        pMVar1 + (ulong)(exitno & 0x1f) * 4 + -6)) {
      *(int *)(ptr_00 + 1) = ((int)target - (int)ptr_00) + -6;
    }
    uVar2 = asm_x86_inslen((uint8_t *)ptr_00);
  }
  lj_mcode_sync(T->mcode,T->mcode + T->szmcode);
  lj_mcode_patch(J,ptr,1);
  return;
}

Assistant:

void lj_asm_patchexit(jit_State *J, GCtrace *T, ExitNo exitno, MCode *target)
{
  MCode *p = T->mcode;
  MCode *mcarea = lj_mcode_patch(J, p, 0);
  MSize len = T->szmcode;
  MCode *px = exitstub_addr(J, exitno) - 6;
  MCode *pe = p+len-6;
#if LJ_GC64
  uint32_t statei = (uint32_t)(GG_OFS(g.vmstate) - GG_OFS(dispatch));
#else
  uint32_t statei = u32ptr(&J2G(J)->vmstate);
#endif
  if (len > 5 && p[len-5] == XI_JMP && p+len-6 + *(int32_t *)(p+len-4) == px)
    *(int32_t *)(p+len-4) = jmprel(J, p+len, target);
  /* Do not patch parent exit for a stack check. Skip beyond vmstate update. */
  for (; p < pe; p += asm_x86_inslen(p)) {
    intptr_t ofs = LJ_GC64 ? (p[0] & 0xf0) == 0x40 : LJ_64;
    if (*(uint32_t *)(p+2+ofs) == statei && p[ofs+LJ_GC64-LJ_64] == XI_MOVmi)
      break;
  }
  lj_assertJ(p < pe, "instruction length decoder failed");
  for (; p < pe; p += asm_x86_inslen(p))
    if ((*(uint16_t *)p & 0xf0ff) == 0x800f && p + *(int32_t *)(p+2) == px)
      *(int32_t *)(p+2) = jmprel(J, p+6, target);
  lj_mcode_sync(T->mcode, T->mcode + T->szmcode);
  lj_mcode_patch(J, mcarea, 1);
}